

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superstep.hpp
# Opt level: O1

int __thiscall
Superstep<int>::runStep
          (Superstep<int> *this,vector<WorkerThread,_std::allocator<WorkerThread>_> *workers,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *inputVectors,
          vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *outputVectors)

{
  int iVar1;
  runtime_error *this_00;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  packaged_task<void_()> packagedTask;
  type boundedFunction;
  undefined1 local_a9;
  Task local_a8;
  vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *local_98;
  packaged_task<void_()> local_90;
  _Task_state<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dima91[P]BSP_pattern_include_superstep_hpp:178:25)_(unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>)>,_std::allocator<int>,_void_()>
  *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  Barrier *local_70;
  Barrier *local_68;
  vector<WorkerThread,_std::allocator<WorkerThread>_> *local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_58;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dima91[P]BSP_pattern_include_superstep_hpp:178:25)_(unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>)>
  local_50;
  
  uVar3 = (long)(this->activitiesFunctions).
                super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->activitiesFunctions).
                super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 6;
  local_98 = outputVectors;
  local_60 = workers;
  if ((ulong)((long)(workers->super__Vector_base<WorkerThread,_std::allocator<WorkerThread>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(workers->super__Vector_base<WorkerThread,_std::allocator<WorkerThread>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 7) < uVar3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "Mismatching between number of workers and number of activities! (#workers < #activities)"
              );
  }
  else {
    local_58 = inputVectors;
    if (uVar3 <= (ulong)(((long)(inputVectors->
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(inputVectors->
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x5555555555555555)) {
      local_68 = &this->commPhaseBarrier;
      Barrier::reset(local_68,(int)uVar3);
      Barrier::reset(&this->compPhaseBarrier,
                     (int)((ulong)((long)(this->activitiesFunctions).
                                         super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->activitiesFunctions).
                                        super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 6));
      local_70 = &this->startBarrier;
      Barrier::reset(local_70,1);
      if ((this->activitiesFunctions).
          super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->activitiesFunctions).
          super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar5 = 0;
        lVar4 = 0;
        uVar3 = 0;
        do {
          local_50._M_bound_args.
          super__Tuple_impl<0UL,_unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
          .
          super__Tuple_impl<1UL,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
          .
          super__Head_base<1UL,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_false>
          ._M_head_impl._M_data =
               (reference_wrapper<std::vector<int,_std::allocator<int>_>_>)
               ((long)&(((local_58->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data + lVar5);
          local_50._M_bound_args.
          super__Tuple_impl<0UL,_unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
          .
          super__Tuple_impl<1UL,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
          .
          super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
          .
          super__Head_base<2UL,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>,_false>
          ._M_head_impl._M_data =
               (_Head_base<2UL,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>,_false>
                )(_Head_base<2UL,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>,_false>
                  )local_98;
          local_80 = (_Task_state<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dima91[P]BSP_pattern_include_superstep_hpp:178:25)_(unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>)>,_std::allocator<int>,_void_()>
                      *)0x0;
          local_50._M_f.this = this;
          local_50._M_bound_args.
          super__Tuple_impl<0UL,_unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
          .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar3;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<std::__future_base::_Task_state<std::_Bind<Superstep<int>::runStep(std::vector<WorkerThread,std::allocator<WorkerThread>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)::_lambda(int,std::vector<int,std::allocator<int>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)_1_(unsigned_long,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>>)>,std::allocator<int>,void()>,std::allocator<int>,std::_Bind<Superstep<int>::runStep(std::vector<WorkerThread,std::allocator<WorkerThread>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)::_lambda(int,std::vector<int,std::allocator<int>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)_1_(unsigned_long,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>>)>&,std::allocator<int>const&>
                    (&local_78,&local_80,(allocator<int> *)&local_a9,&local_50,
                     (allocator<int> *)&local_a9);
          local_a8._M_state.
          super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = &local_80->super__Task_state_base<void_()>;
          local_90._M_state.
          super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_90._M_state.
          super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_a8._M_state.
          super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = local_78._M_pi;
          WorkerThread::assignActivity
                    ((WorkerThread *)
                     ((long)&(((local_60->
                               super__Vector_base<WorkerThread,_std::allocator<WorkerThread>_>).
                               _M_impl.super__Vector_impl_data._M_start)->workerThread)._M_id.
                             _M_thread + lVar4),&local_a8);
          std::packaged_task<void_()>::~packaged_task(&local_a8);
          std::packaged_task<void_()>::~packaged_task(&local_90);
          uVar3 = uVar3 + 1;
          lVar4 = lVar4 + 0x80;
          lVar5 = lVar5 + 0x18;
        } while (uVar3 < (ulong)((long)(this->activitiesFunctions).
                                       super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->activitiesFunctions).
                                       super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 6));
      }
      Barrier::decreaseBarrier(local_70);
      Barrier::waitForFinish(local_68);
      if ((this->atExitF).super__Function_base._M_manager != (_Manager_type)0x0) {
        iVar1 = (*(this->atExitF)._M_invoker)((_Any_data *)&this->atExitF,local_98);
        return iVar1;
      }
      uVar2 = std::__throw_bad_function_call();
      __cxa_free_exception(this);
      _Unwind_Resume(uVar2);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "Mismatching between number of activities and number of input queues! (#activities > #queues)"
              );
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int Superstep<T>::runStep (std::vector<WorkerThread> &workers,
							std::vector<std::vector<T>>	&inputVectors,
							std::vector<LockableVector<T>> &outputVectors) {

	if (workers.size () < activitiesFunctions.size()) {
		throw std::runtime_error ("Mismatching between number of workers and number of activities! (#workers < #activities)");
	}
	if (inputVectors.size() < activitiesFunctions.size())
		throw std::runtime_error ("Mismatching between number of activities and number of input queues! (#activities > #queues)");

	// Resetting bariers
	commPhaseBarrier.reset (activitiesFunctions.size());
	compPhaseBarrier.reset (activitiesFunctions.size());
	startBarrier.reset (1);


	// Setting up worker threads
	for (size_t i=0; i<activitiesFunctions.size(); i++) {
		// Binding packaged task to arguments
		auto lambdaFunction	= [&] (int index, std::vector<T> &inputItems, std::vector<LockableVector<T>> &outputItems) {
			workerFunction (index, inputItems, outputItems);
		};
		auto boundedFunction	= std::bind (lambdaFunction, i, std::ref(inputVectors[i]), std::ref(outputVectors));
		auto packagedTask		= std::packaged_task<void()> (boundedFunction);

		// Assigning created packaged_task to a worker
		workers[i].assignActivity (std::move(packagedTask));
	}

	// Starting workers and waiting for their completion
	startBarrier.decreaseBarrier ();
	commPhaseBarrier.waitForFinish ();
	
	return atExitF (outputVectors);
}